

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O0

int i2d_PKCS7(PKCS7 *a,uchar **out)

{
  uchar *puVar1;
  uint8_t **out_local;
  PKCS7 *p7_local;
  
  if ((ulong)a->length < 0x80000000) {
    if (out == (uchar **)0x0) {
      p7_local._4_4_ = (int)a->length;
    }
    else {
      if (*out == (uchar *)0x0) {
        puVar1 = (uchar *)OPENSSL_memdup(a->asn1,a->length);
        *out = puVar1;
        if (*out == (uchar *)0x0) {
          return -1;
        }
      }
      else {
        OPENSSL_memcpy(*out,a->asn1,a->length);
        *out = *out + a->length;
      }
      p7_local._4_4_ = (int)a->length;
    }
  }
  else {
    ERR_put_error(0x13,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_x509.cc"
                  ,0x144);
    p7_local._4_4_ = -1;
  }
  return p7_local._4_4_;
}

Assistant:

int i2d_PKCS7(const PKCS7 *p7, uint8_t **out) {
  if (p7->ber_len > INT_MAX) {
    OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
    return -1;
  }

  if (out == NULL) {
    return (int)p7->ber_len;
  }

  if (*out == NULL) {
    *out =
        reinterpret_cast<uint8_t *>(OPENSSL_memdup(p7->ber_bytes, p7->ber_len));
    if (*out == NULL) {
      return -1;
    }
  } else {
    OPENSSL_memcpy(*out, p7->ber_bytes, p7->ber_len);
    *out += p7->ber_len;
  }
  return (int)p7->ber_len;
}